

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::value_is_likely_non_uniform(Impl *impl,Value *value)

{
  bool bVar1;
  ValueKind VVar2;
  uint uVar3;
  uint uVar4;
  Value *pVVar5;
  Instruction *pIVar6;
  CallInst *this;
  
  pVVar5 = LLVMBC::Internal::resolve_proxy(value);
  VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
  bVar1 = LLVMBC::Constant::is_base_of_value_kind(VVar2);
  if (bVar1) {
    return false;
  }
LAB_001694fb:
  do {
    if (value == (Value *)0x0) {
      value = (Value *)0x0;
LAB_001695e5:
      bVar1 = value_is_dx_op_instrinsic(value,BufferLoad);
      if ((((!bVar1) && (bVar1 = value_is_dx_op_instrinsic(value,RawBufferLoad), !bVar1)) &&
          (bVar1 = value_is_dx_op_instrinsic(value,CBufferLoad), !bVar1)) &&
         (bVar1 = value_is_dx_op_instrinsic(value,CBufferLoadLegacy), !bVar1)) {
        bVar1 = value_is_dx_op_instrinsic(value,LoadInput);
        if (bVar1) {
          return true;
        }
        bVar1 = value_is_dx_op_instrinsic(value,InstanceID);
        return bVar1;
      }
      this = LLVMBC::cast<LLVMBC::CallInst>(value);
      uVar3 = LLVMBC::Instruction::getNumOperands(&this->super_Instruction);
      if (uVar3 < 3) {
        return false;
      }
      uVar3 = 2;
      do {
        pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,uVar3);
        bVar1 = value_is_likely_non_uniform(impl,pVVar5);
        if (bVar1) {
          return bVar1;
        }
        uVar3 = uVar3 + 1;
        uVar4 = LLVMBC::Instruction::getNumOperands(&this->super_Instruction);
      } while (uVar3 < uVar4);
      return bVar1;
    }
    pIVar6 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar6);
    if (VVar2 == UnaryOperator) {
LAB_0016954c:
      value = LLVMBC::Instruction::getOperand(pIVar6,0);
      pVVar5 = LLVMBC::Internal::resolve_proxy(value);
      VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
      bVar1 = LLVMBC::Constant::is_base_of_value_kind(VVar2);
      if (bVar1) {
        return false;
      }
      goto LAB_001694fb;
    }
    pIVar6 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar6);
    if (VVar2 == Cast) goto LAB_0016954c;
    pIVar6 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar6);
    if (VVar2 == ExtractValue) goto LAB_0016954c;
    pIVar6 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar6);
    if (VVar2 != BinaryOperator) goto LAB_001695e5;
    pVVar5 = LLVMBC::Instruction::getOperand(pIVar6,0);
    bVar1 = value_is_likely_non_uniform(impl,pVVar5);
    if (bVar1) {
      return true;
    }
    value = LLVMBC::Instruction::getOperand(pIVar6,1);
    pVVar5 = LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind(pVVar5);
    bVar1 = LLVMBC::Constant::is_base_of_value_kind(VVar2);
    if (bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool value_is_likely_non_uniform(Converter::Impl &impl, const llvm::Value *value)
{
	for (;;)
	{
		// If the index is loaded from PS varying, it's almost guaranteed to be nonuniform in some way.
		// Similar with using InstanceID as bindless index.
		if (llvm::isa<llvm::Constant>(value))
			return false;
		else if (const auto *unary = llvm::dyn_cast<llvm::UnaryOperator>(value))
			value = unary->getOperand(0);
		else if (const auto *cast_op = llvm::dyn_cast<llvm::CastInst>(value))
			value = cast_op->getOperand(0);
		else if (const auto *extract_value = llvm::dyn_cast<llvm::ExtractValueInst>(value))
			value = extract_value->getOperand(0);
		else
			break;
	}

	if (const auto *binary = llvm::dyn_cast<llvm::BinaryOperator>(value))
	{
		return value_is_likely_non_uniform(impl, binary->getOperand(0)) ||
		       value_is_likely_non_uniform(impl, binary->getOperand(1));
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::BufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::RawBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoad) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::CBufferLoadLegacy))
	{
		auto *call = llvm::cast<llvm::CallInst>(value);
		for (uint32_t i = 2; i < call->getNumOperands(); i++)
			if (value_is_likely_non_uniform(impl, call->getOperand(i)))
				return true;
		return false;
	}
	else if (value_is_dx_op_instrinsic(value, DXIL::Op::LoadInput) ||
	         value_is_dx_op_instrinsic(value, DXIL::Op::InstanceID))
	{
		return true;
	}
	else
		return false;
}